

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmq.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  __pid_t _Var1;
  int iVar2;
  uint uVar3;
  LogMQ *this;
  int status;
  long *local_40 [2];
  long local_30 [2];
  
  _Var1 = fork();
  if (_Var1 == 0) {
    uVar3 = system("../logmq/logmq");
    exit(uVar3 >> 8 & 0xff);
  }
  if (-1 < _Var1) {
    sleep(2);
    this = (LogMQ *)operator_new(0x30);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"/liblogger","");
    liblogger::LogMQ::LogMQ(this,(string *)local_40);
    liblogger::LogManager::Add((ILogger *)this);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    liblogger::LogManager::PrintAll();
    liblogger::LogDebug("Debug Logging #1");
    liblogger::LogDebug("Debug Logging #%d",2);
    liblogger::LogInfo("Info Logging #1");
    liblogger::LogInfo("Info Logging #%d",2);
    liblogger::LogNotice("Notice Logging #1");
    liblogger::LogNotice("%s Logging #2","Notice");
    liblogger::LogWarning("Warning!!!!!!");
    liblogger::LogWarning("Warning!!!!!! #%d",2);
    liblogger::LogError("This is an Error");
    liblogger::LogError("This is an Error %d",2);
    liblogger::LogError("Something Critical happened");
    liblogger::LogError("Something Critical happened %s","Really BAD!");
    liblogger::LogAlert("Alert Alert");
    liblogger::LogAlert("Alert Alert %s","Alert");
    liblogger::LogCritical("TestLog Critical!");
    liblogger::LogEmergency("TestLog Emergency!");
    liblogger::LogManager::RemoveAll();
    iVar2 = kill(_Var1,0xf);
    if (-1 < iVar2) {
      local_40[0] = (long *)((ulong)local_40[0] & 0xffffffff00000000);
      _Var1 = waitpid(_Var1,(int *)local_40,0);
      if (-1 < _Var1) {
        return 0;
      }
    }
  }
  abort();
}

Assistant:

int main(int argc, char ** argv)
{
	pid_t pid = fork();
	if (pid == 0) {
		int ret = system("../logmq/logmq");
		exit(WEXITSTATUS(ret));
	}
	if (pid < 0)
		abort();

	sleep(2); //Poor workaround for race if we start before the child

	LogManager::Add(new LogMQ());

	examples();

	LogManager::RemoveAll();

	if (kill(pid, SIGTERM) < 0)
		abort();

	int status = 0;
	if (waitpid(pid, &status, 0) < 0)
		abort();

	return 0;
}